

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O0

int re2::CountArgs(string *s)

{
  int local_1c;
  char *pcStack_18;
  int n;
  char *p;
  string *s_local;
  
  pcStack_18 = (char *)std::__cxx11::string::c_str();
  local_1c = 0;
  while( true ) {
    pcStack_18 = strstr(pcStack_18,"%s");
    if (pcStack_18 == (char *)0x0) break;
    pcStack_18 = pcStack_18 + 2;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int CountArgs(const string& s) {
  const char *p = s.c_str();
  int n = 0;
  while ((p = strstr(p, "%s")) != NULL) {
    p += 2;
    n++;
  }
  return n;
}